

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp.h
# Opt level: O0

void ncnn::innerproduct_transform_kernel_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  int p_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  float *g0_1;
  int q_1;
  Mat weight_data_r2_1;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int p;
  float *k7;
  float *k6;
  float *k5;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  float *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  Allocator *in_stack_fffffffffffff0d8;
  undefined1 in_stack_fffffffffffff0e0 [16];
  undefined1 auVar8 [12];
  undefined1 in_stack_fffffffffffff0f0 [16];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  Allocator *in_stack_fffffffffffff160;
  undefined8 in_stack_fffffffffffff168;
  Mat *in_stack_fffffffffffff170;
  int local_cc4;
  int local_c3c;
  undefined1 (*local_c38) [16];
  undefined1 (*local_c30) [16];
  undefined1 (*local_c28) [16];
  undefined1 (*local_c20) [16];
  undefined8 *local_c18;
  int local_c0c;
  void *local_c08;
  int *local_c00;
  long local_bf8;
  undefined4 local_bf0;
  long *local_be8;
  undefined4 local_be0;
  int local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined8 local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  int local_aac;
  undefined1 (*local_aa8) [32];
  undefined1 (*local_aa0) [32];
  undefined1 (*local_a98) [32];
  undefined1 (*local_a90) [32];
  undefined1 (*local_a88) [32];
  undefined1 (*local_a80) [32];
  undefined1 (*local_a78) [32];
  undefined1 (*local_a70) [32];
  undefined8 *local_a68;
  int local_a60;
  void *local_a50;
  int *local_a48;
  long local_a40;
  undefined4 local_a38;
  long *local_a30;
  undefined4 local_a28;
  int local_a24;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined8 local_a10;
  int local_a04;
  int local_9f8;
  int local_9f4;
  long *local_9f0;
  long *local_9e8;
  void **local_9e0;
  void **local_9d0;
  int local_9b0;
  undefined4 local_9ac;
  void **local_9a8;
  int local_990;
  undefined4 local_98c;
  void **local_988;
  int local_97c;
  void **local_978;
  int local_96c;
  void **local_968;
  int local_95c;
  void **local_958;
  int local_94c;
  void **local_948;
  int local_93c;
  long *local_938;
  int local_92c;
  void **local_928;
  int local_91c;
  void **local_918;
  int local_90c;
  void **local_908;
  int local_8fc;
  void **local_8f8;
  int local_8ec;
  void **local_8e8;
  int local_8dc;
  void **local_8d8;
  int local_8cc;
  void **local_8c8;
  int local_8bc;
  void **local_8b8;
  int local_8ac;
  long *local_8a8;
  undefined1 (*local_8a0) [16];
  undefined1 (*local_898) [16];
  undefined1 (*local_890) [16];
  undefined1 (*local_888) [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined1 (*local_768) [16];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 *local_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 *local_708;
  undefined1 (*local_700) [32];
  undefined1 (*local_6f8) [32];
  undefined1 (*local_6f0) [32];
  undefined1 (*local_6e8) [32];
  undefined1 (*local_6e0) [32];
  undefined1 (*local_6d8) [32];
  undefined1 (*local_6d0) [32];
  undefined1 (*local_6c8) [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 (*local_448) [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_298;
  int local_290;
  undefined4 local_28c;
  long *local_288;
  long *local_280;
  int local_270;
  undefined4 local_26c;
  long *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  void *local_58;
  
  auVar8 = in_stack_fffffffffffff0e0._4_12_;
  local_a04 = 1;
  if ((*(byte *)(in_R8 + 0x27) & 1) != 0) {
    if (in_ECX % 8 == 0) {
      local_cc4 = 8;
    }
    else {
      local_cc4 = 1;
      if (in_ECX % 4 == 0) {
        local_cc4 = 4;
      }
    }
    local_a04 = local_cc4;
  }
  local_9f8 = in_ECX;
  local_9f4 = in_EDX;
  local_9f0 = in_RSI;
  local_9e8 = in_RDI;
  if (local_a04 == 8) {
    Mat::reshape(in_stack_fffffffffffff170,(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
                 (int)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
    Mat::create(in_stack_fffffffffffff0f0._8_8_,in_stack_fffffffffffff0f0._4_4_,
                in_stack_fffffffffffff0f0._0_4_,auVar8._4_8_,auVar8._0_4_,in_stack_fffffffffffff0d8)
    ;
    for (local_a60 = 0; local_a60 + 7 < local_9f8; local_a60 = local_a60 + 8) {
      local_8ac = local_a60 / 8;
      local_8a8 = local_9f0;
      local_a68 = (undefined8 *)
                  (*local_9f0 +
                  (long)*(int *)((long)local_9f0 + 0x2c) * (long)local_8ac * local_9f0[2]);
      local_8b8 = &local_a50;
      local_8bc = local_a60;
      local_a70 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_a60 * local_a40);
      local_8cc = local_a60 + 1;
      local_8c8 = &local_a50;
      local_a78 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_8cc * local_a40);
      local_8dc = local_a60 + 2;
      local_8d8 = &local_a50;
      local_a80 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_8dc * local_a40);
      local_8ec = local_a60 + 3;
      local_8e8 = &local_a50;
      local_a88 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_8ec * local_a40);
      local_8fc = local_a60 + 4;
      local_8f8 = &local_a50;
      local_a90 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_8fc * local_a40);
      local_90c = local_a60 + 5;
      local_908 = &local_a50;
      local_a98 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_90c * local_a40);
      local_91c = local_a60 + 6;
      local_918 = &local_a50;
      local_aa0 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_91c * local_a40);
      local_92c = local_a60 + 7;
      local_928 = &local_a50;
      local_aa8 = (undefined1 (*) [32])
                  ((long)local_a50 + (long)local_a24 * (long)local_92c * local_a40);
      for (local_aac = 0; local_aac + 7 < local_9f4; local_aac = local_aac + 8) {
        local_6c8 = local_a70;
        local_180 = *(undefined8 *)*local_a70;
        uStack_178 = *(undefined8 *)(*local_a70 + 8);
        uStack_170 = *(undefined8 *)(*local_a70 + 0x10);
        uStack_168 = *(undefined8 *)(*local_a70 + 0x18);
        local_6d0 = local_a78;
        local_1a0 = *(undefined8 *)*local_a78;
        uStack_198 = *(undefined8 *)(*local_a78 + 8);
        uStack_190 = *(undefined8 *)(*local_a78 + 0x10);
        uStack_188 = *(undefined8 *)(*local_a78 + 0x18);
        local_6d8 = local_a80;
        local_1c0 = *(undefined8 *)*local_a80;
        uStack_1b8 = *(undefined8 *)(*local_a80 + 8);
        uStack_1b0 = *(undefined8 *)(*local_a80 + 0x10);
        uStack_1a8 = *(undefined8 *)(*local_a80 + 0x18);
        local_6e0 = local_a88;
        local_1e0 = *(undefined8 *)*local_a88;
        uStack_1d8 = *(undefined8 *)(*local_a88 + 8);
        uStack_1d0 = *(undefined8 *)(*local_a88 + 0x10);
        uStack_1c8 = *(undefined8 *)(*local_a88 + 0x18);
        local_6e8 = local_a90;
        local_200 = *(undefined8 *)*local_a90;
        uStack_1f8 = *(undefined8 *)(*local_a90 + 8);
        uStack_1f0 = *(undefined8 *)(*local_a90 + 0x10);
        uStack_1e8 = *(undefined8 *)(*local_a90 + 0x18);
        local_6f0 = local_a98;
        local_220 = *(undefined8 *)*local_a98;
        uStack_218 = *(undefined8 *)(*local_a98 + 8);
        uStack_210 = *(undefined8 *)(*local_a98 + 0x10);
        uStack_208 = *(undefined8 *)(*local_a98 + 0x18);
        local_6f8 = local_aa0;
        local_240 = *(undefined8 *)*local_aa0;
        uStack_238 = *(undefined8 *)(*local_aa0 + 8);
        uStack_230 = *(undefined8 *)(*local_aa0 + 0x10);
        uStack_228 = *(undefined8 *)(*local_aa0 + 0x18);
        local_700 = local_aa8;
        local_260 = *(undefined8 *)*local_aa8;
        uStack_258 = *(undefined8 *)(*local_aa8 + 8);
        uStack_250 = *(undefined8 *)(*local_aa8 + 0x10);
        uStack_248 = *(undefined8 *)(*local_aa8 + 0x18);
        local_488 = &local_ae0;
        local_490 = &local_b00;
        local_498 = &local_b20;
        local_4a0 = &local_b40;
        local_4a8 = &local_b60;
        local_4b0 = &local_b80;
        local_4b8 = &local_ba0;
        local_4c0 = &local_bc0;
        local_4e0 = vunpcklps_avx(*local_a70,*local_a78);
        local_500 = vunpckhps_avx(*local_a70,*local_a78);
        local_520 = vunpcklps_avx(*local_a80,*local_a88);
        local_540 = vunpckhps_avx(*local_a80,*local_a88);
        local_560 = vunpcklps_avx(*local_a90,*local_a98);
        local_580 = vunpckhps_avx(*local_a90,*local_a98);
        local_5a0 = vunpcklps_avx(*local_aa0,*local_aa8);
        local_5c0 = vunpckhps_avx(*local_aa0,*local_aa8);
        local_5e0 = vunpcklpd_avx(local_4e0,local_520);
        local_600 = vunpckhpd_avx(local_4e0,local_520);
        local_620 = vunpcklpd_avx(local_500,local_540);
        local_640 = vunpckhpd_avx(local_500,local_540);
        local_660 = vunpcklpd_avx(local_560,local_5a0);
        local_680 = vunpckhpd_avx(local_560,local_5a0);
        local_6a0 = vunpcklpd_avx(local_580,local_5c0);
        local_6c0 = vunpckhpd_avx(local_580,local_5c0);
        local_ae0 = local_5e0._0_8_;
        uStack_ad8 = local_5e0._8_8_;
        uStack_ad0 = local_660._0_8_;
        uStack_ac8 = local_660._8_8_;
        local_b00 = local_600._0_8_;
        uStack_af8 = local_600._8_8_;
        uStack_af0 = local_680._0_8_;
        uStack_ae8 = local_680._8_8_;
        local_b20 = local_620._0_8_;
        uStack_b18 = local_620._8_8_;
        uStack_b10 = local_6a0._0_8_;
        uStack_b08 = local_6a0._8_8_;
        local_b40 = local_640._0_8_;
        uStack_b38 = local_640._8_8_;
        uStack_b30 = local_6c0._0_8_;
        uStack_b28 = local_6c0._8_8_;
        auVar7 = vperm2f128_avx(local_5e0,local_660,0x31);
        uStack_b48 = auVar7._24_8_;
        uStack_b50 = auVar7._16_8_;
        uStack_b58 = auVar7._8_8_;
        local_b60 = auVar7._0_8_;
        auVar7 = vperm2f128_avx(local_600,local_680,0x31);
        uStack_b68 = auVar7._24_8_;
        uStack_b70 = auVar7._16_8_;
        uStack_b78 = auVar7._8_8_;
        local_b80 = auVar7._0_8_;
        auVar7 = vperm2f128_avx(local_620,local_6a0,0x31);
        uStack_b88 = auVar7._24_8_;
        uStack_b90 = auVar7._16_8_;
        uStack_b98 = auVar7._8_8_;
        local_ba0 = auVar7._0_8_;
        auVar7 = vperm2f128_avx(local_640,local_6c0,0x31);
        uStack_ba8 = auVar7._24_8_;
        uStack_bb0 = auVar7._16_8_;
        uStack_bb8 = auVar7._8_8_;
        local_bc0 = auVar7._0_8_;
        local_298 = local_a68;
        local_2c0 = local_5e0._0_8_;
        uStack_2b8 = local_5e0._8_8_;
        uStack_2b0 = local_660._0_8_;
        uStack_2a8 = local_660._8_8_;
        *local_a68 = local_5e0._0_8_;
        local_a68[1] = local_5e0._8_8_;
        local_a68[2] = local_660._0_8_;
        local_a68[3] = local_660._8_8_;
        local_2c8 = local_a68 + 4;
        local_300 = local_600._0_8_;
        uStack_2f8 = local_600._8_8_;
        uStack_2f0 = local_680._0_8_;
        uStack_2e8 = local_680._8_8_;
        *local_2c8 = local_600._0_8_;
        local_a68[5] = local_600._8_8_;
        local_a68[6] = local_680._0_8_;
        local_a68[7] = local_680._8_8_;
        local_308 = local_a68 + 8;
        local_340 = local_620._0_8_;
        uStack_338 = local_620._8_8_;
        uStack_330 = local_6a0._0_8_;
        uStack_328 = local_6a0._8_8_;
        *local_308 = local_620._0_8_;
        local_a68[9] = local_620._8_8_;
        local_a68[10] = local_6a0._0_8_;
        local_a68[0xb] = local_6a0._8_8_;
        local_348 = local_a68 + 0xc;
        local_380 = local_640._0_8_;
        uStack_378 = local_640._8_8_;
        uStack_370 = local_6c0._0_8_;
        uStack_368 = local_6c0._8_8_;
        *local_348 = local_640._0_8_;
        local_a68[0xd] = local_640._8_8_;
        local_a68[0xe] = local_6c0._0_8_;
        local_a68[0xf] = local_6c0._8_8_;
        local_388 = local_a68 + 0x10;
        local_3c0 = local_b60;
        uStack_3b8 = uStack_b58;
        uStack_3b0 = uStack_b50;
        uStack_3a8 = uStack_b48;
        *local_388 = local_b60;
        local_a68[0x11] = uStack_b58;
        local_a68[0x12] = uStack_b50;
        local_a68[0x13] = uStack_b48;
        local_3c8 = local_a68 + 0x14;
        local_400 = local_b80;
        uStack_3f8 = uStack_b78;
        uStack_3f0 = uStack_b70;
        uStack_3e8 = uStack_b68;
        *local_3c8 = local_b80;
        local_a68[0x15] = uStack_b78;
        local_a68[0x16] = uStack_b70;
        local_a68[0x17] = uStack_b68;
        local_408 = local_a68 + 0x18;
        local_440 = local_ba0;
        uStack_438 = uStack_b98;
        uStack_430 = uStack_b90;
        uStack_428 = uStack_b88;
        *local_408 = local_ba0;
        local_a68[0x19] = uStack_b98;
        local_a68[0x1a] = uStack_b90;
        local_a68[0x1b] = uStack_b88;
        local_448 = (undefined1 (*) [32])(local_a68 + 0x1c);
        local_480 = local_bc0;
        uStack_478 = uStack_bb8;
        uStack_470 = uStack_bb0;
        uStack_468 = uStack_ba8;
        *local_448 = auVar7;
        local_a70 = local_a70 + 1;
        local_a78 = local_a78 + 1;
        local_a80 = local_a80 + 1;
        local_a88 = local_a88 + 1;
        local_a90 = local_a90 + 1;
        local_a98 = local_a98 + 1;
        local_aa0 = local_aa0 + 1;
        local_aa8 = local_aa8 + 1;
        local_a68 = local_a68 + 0x20;
        local_160 = local_260;
        uStack_158 = uStack_258;
        uStack_150 = uStack_250;
        uStack_148 = uStack_248;
        local_140 = local_240;
        uStack_138 = uStack_238;
        uStack_130 = uStack_230;
        uStack_128 = uStack_228;
        local_120 = local_220;
        uStack_118 = uStack_218;
        uStack_110 = uStack_210;
        uStack_108 = uStack_208;
        local_100 = local_200;
        uStack_f8 = uStack_1f8;
        uStack_f0 = uStack_1f0;
        uStack_e8 = uStack_1e8;
        local_e0 = local_1e0;
        uStack_d8 = uStack_1d8;
        uStack_d0 = uStack_1d0;
        uStack_c8 = uStack_1c8;
        local_c0 = local_1c0;
        uStack_b8 = uStack_1b8;
        uStack_b0 = uStack_1b0;
        uStack_a8 = uStack_1a8;
        local_a0 = local_1a0;
        uStack_98 = uStack_198;
        uStack_90 = uStack_190;
        uStack_88 = uStack_188;
        local_80 = local_180;
        uStack_78 = uStack_178;
        uStack_70 = uStack_170;
        uStack_68 = uStack_168;
      }
      for (; local_aac < local_9f4; local_aac = local_aac + 1) {
        *(undefined4 *)local_a68 = *(undefined4 *)*local_a70;
        *(undefined4 *)((long)local_a68 + 4) = *(undefined4 *)*local_a78;
        *(undefined4 *)(local_a68 + 1) = *(undefined4 *)*local_a80;
        *(undefined4 *)((long)local_a68 + 0xc) = *(undefined4 *)*local_a88;
        *(undefined4 *)(local_a68 + 2) = *(undefined4 *)*local_a90;
        *(undefined4 *)((long)local_a68 + 0x14) = *(undefined4 *)*local_a98;
        *(undefined4 *)(local_a68 + 3) = *(undefined4 *)*local_aa0;
        *(undefined4 *)((long)local_a68 + 0x1c) = *(undefined4 *)*local_aa8;
        local_a68 = local_a68 + 4;
        local_aa8 = (undefined1 (*) [32])(*local_aa8 + 4);
        local_aa0 = (undefined1 (*) [32])(*local_aa0 + 4);
        local_a98 = (undefined1 (*) [32])(*local_a98 + 4);
        local_a90 = (undefined1 (*) [32])(*local_a90 + 4);
        local_a88 = (undefined1 (*) [32])(*local_a88 + 4);
        local_a80 = (undefined1 (*) [32])(*local_a80 + 4);
        local_a78 = (undefined1 (*) [32])(*local_a78 + 4);
        local_a70 = (undefined1 (*) [32])(*local_a70 + 4);
      }
    }
    local_9e0 = &local_a50;
    local_988 = local_9e0;
    if (local_a48 != (int *)0x0) {
      local_98c = 0xffffffff;
      LOCK();
      local_990 = *local_a48;
      *local_a48 = *local_a48 + -1;
      UNLOCK();
      if (local_990 == 1) {
        if (local_a30 == (long *)0x0) {
          if (local_a50 != (void *)0x0) {
            free(local_a50);
          }
        }
        else {
          (**(code **)(*local_a30 + 0x18))(local_a30,local_a50);
        }
      }
    }
    local_a50 = (void *)0x0;
    local_a40 = 0;
    local_a38 = 0;
    local_a28 = 0;
    local_a24 = 0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a10 = 0;
    local_a48 = (int *)0x0;
  }
  if (local_a04 == 4) {
    Mat::reshape(in_stack_fffffffffffff170,(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
                 (int)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
    Mat::create(in_stack_fffffffffffff0f0._8_8_,in_stack_fffffffffffff0f0._4_4_,
                in_stack_fffffffffffff0f0._0_4_,auVar8._4_8_,auVar8._0_4_,in_stack_fffffffffffff0d8)
    ;
    for (local_c0c = 0; local_c0c + 3 < local_9f8; local_c0c = local_c0c + 4) {
      local_93c = local_c0c / 4;
      local_938 = local_9f0;
      local_c18 = (undefined8 *)
                  (*local_9f0 +
                  (long)*(int *)((long)local_9f0 + 0x2c) * (long)local_93c * local_9f0[2]);
      local_948 = &local_c08;
      local_94c = local_c0c;
      local_c20 = (undefined1 (*) [16])
                  ((long)local_c08 + (long)local_bdc * (long)local_c0c * local_bf8);
      local_95c = local_c0c + 1;
      local_958 = &local_c08;
      local_c28 = (undefined1 (*) [16])
                  ((long)local_c08 + (long)local_bdc * (long)local_95c * local_bf8);
      local_96c = local_c0c + 2;
      local_968 = &local_c08;
      local_c30 = (undefined1 (*) [16])
                  ((long)local_c08 + (long)local_bdc * (long)local_96c * local_bf8);
      local_97c = local_c0c + 3;
      local_978 = &local_c08;
      local_c38 = (undefined1 (*) [16])
                  ((long)local_c08 + (long)local_bdc * (long)local_97c * local_bf8);
      for (local_c3c = 0; local_c3c + 3 < local_9f4; local_c3c = local_c3c + 4) {
        local_888 = local_c20;
        local_850 = *(undefined8 *)*local_c20;
        uStack_848 = *(undefined8 *)(*local_c20 + 8);
        local_890 = local_c28;
        local_860 = *(undefined8 *)*local_c28;
        uStack_858 = *(undefined8 *)(*local_c28 + 8);
        local_898 = local_c30;
        local_870 = *(undefined8 *)*local_c30;
        uStack_868 = *(undefined8 *)(*local_c30 + 8);
        local_8a0 = local_c38;
        local_880 = *(undefined8 *)*local_c38;
        uStack_878 = *(undefined8 *)(*local_c38 + 8);
        auVar5 = vunpcklps_avx(*local_c20,*local_c28);
        local_eb0 = auVar5._0_8_;
        uStack_ea8 = auVar5._8_8_;
        auVar6 = vunpcklps_avx(*local_c30,*local_c38);
        local_ec0 = auVar6._0_8_;
        uStack_eb8 = auVar6._8_8_;
        auVar2 = vunpckhps_avx(*local_c20,*local_c28);
        local_ed0 = auVar2._0_8_;
        uStack_ec8 = auVar2._8_8_;
        auVar3 = vunpckhps_avx(*local_c30,*local_c38);
        local_ee0 = auVar3._0_8_;
        uStack_ed8 = auVar3._8_8_;
        local_7d0 = local_eb0;
        uStack_7c8 = uStack_ea8;
        local_7e0 = local_ec0;
        uStack_7d8 = uStack_eb8;
        auVar4 = vunpcklpd_avx(auVar5,auVar6);
        local_ef0 = auVar4._0_8_;
        uStack_ee8 = auVar4._8_8_;
        local_790 = local_ec0;
        uStack_788 = uStack_eb8;
        local_7a0 = local_eb0;
        uStack_798 = uStack_ea8;
        auVar4 = vunpckhpd_avx(auVar5,auVar6);
        local_f00 = auVar4._0_8_;
        uStack_ef8 = auVar4._8_8_;
        local_7f0 = local_ed0;
        uStack_7e8 = uStack_ec8;
        local_800 = local_ee0;
        uStack_7f8 = uStack_ed8;
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        local_760 = auVar4._0_8_;
        uStack_758 = auVar4._8_8_;
        local_7b0 = local_ee0;
        uStack_7a8 = uStack_ed8;
        local_7c0 = local_ed0;
        uStack_7b8 = uStack_ec8;
        auVar4 = vunpckhpd_avx(auVar2,auVar3);
        local_780 = auVar4._0_8_;
        uStack_778 = auVar4._8_8_;
        local_708 = local_c18;
        local_720 = local_ef0;
        uStack_718 = uStack_ee8;
        *local_c18 = local_ef0;
        local_c18[1] = uStack_ee8;
        local_728 = local_c18 + 2;
        local_740 = local_f00;
        uStack_738 = uStack_ef8;
        *local_728 = local_f00;
        local_c18[3] = uStack_ef8;
        local_748 = local_c18 + 4;
        *local_748 = local_760;
        local_c18[5] = uStack_758;
        local_768 = (undefined1 (*) [16])(local_c18 + 6);
        *local_768 = auVar4;
        local_c20 = local_c20 + 1;
        local_c28 = local_c28 + 1;
        local_c30 = local_c30 + 1;
        local_c38 = local_c38 + 1;
        local_c18 = local_c18 + 8;
        local_840 = local_880;
        uStack_838 = uStack_878;
        local_830 = local_870;
        uStack_828 = uStack_868;
        local_820 = local_860;
        uStack_818 = uStack_858;
        local_810 = local_850;
        uStack_808 = uStack_848;
      }
      for (; local_c3c < local_9f4; local_c3c = local_c3c + 1) {
        *(undefined4 *)local_c18 = *(undefined4 *)*local_c20;
        *(undefined4 *)((long)local_c18 + 4) = *(undefined4 *)*local_c28;
        *(undefined4 *)(local_c18 + 1) = *(undefined4 *)*local_c30;
        *(undefined4 *)((long)local_c18 + 0xc) = *(undefined4 *)*local_c38;
        local_c18 = local_c18 + 2;
        local_c38 = (undefined1 (*) [16])(*local_c38 + 4);
        local_c30 = (undefined1 (*) [16])(*local_c30 + 4);
        local_c28 = (undefined1 (*) [16])(*local_c28 + 4);
        local_c20 = (undefined1 (*) [16])(*local_c20 + 4);
      }
    }
    local_9d0 = &local_c08;
    local_9a8 = local_9d0;
    if (local_c00 != (int *)0x0) {
      local_9ac = 0xffffffff;
      LOCK();
      local_9b0 = *local_c00;
      *local_c00 = *local_c00 + -1;
      UNLOCK();
      if (local_9b0 == 1) {
        if (local_be8 == (long *)0x0) {
          if (local_c08 != (void *)0x0) {
            free(local_c08);
          }
        }
        else {
          (**(code **)(*local_be8 + 0x18))(local_be8,local_c08);
        }
      }
    }
    local_c08 = (void *)0x0;
    local_bf8 = 0;
    local_bf0 = 0;
    local_be0 = 0;
    local_bdc = 0;
    local_bd8 = 0;
    local_bd4 = 0;
    local_bd0 = 0;
    local_bc8 = 0;
    local_c00 = (int *)0x0;
  }
  if (local_a04 == 1) {
    local_280 = local_9f0;
    local_288 = local_9e8;
    if (local_9f0 != local_9e8) {
      if (local_9e8[1] != 0) {
        piVar1 = (int *)local_9e8[1];
        local_28c = 1;
        LOCK();
        local_290 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_268 = local_9f0;
      if (local_9f0[1] != 0) {
        piVar1 = (int *)local_9f0[1];
        local_26c = 0xffffffff;
        LOCK();
        local_270 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_270 == 1) {
          if (local_9f0[4] == 0) {
            local_58 = (void *)*local_9f0;
            if (local_58 != (void *)0x0) {
              free(local_58);
            }
          }
          else {
            (**(code **)(*(long *)local_9f0[4] + 0x18))((long *)local_9f0[4],*local_9f0);
          }
        }
      }
      *local_9f0 = 0;
      local_9f0[2] = 0;
      *(undefined4 *)(local_9f0 + 3) = 0;
      *(undefined4 *)(local_9f0 + 5) = 0;
      *(undefined4 *)((long)local_9f0 + 0x2c) = 0;
      *(undefined4 *)(local_9f0 + 6) = 0;
      *(undefined4 *)((long)local_9f0 + 0x34) = 0;
      *(undefined4 *)(local_9f0 + 7) = 0;
      local_9f0[8] = 0;
      local_9f0[1] = 0;
      *local_9f0 = *local_288;
      local_9f0[1] = local_288[1];
      local_9f0[2] = local_288[2];
      *(int *)(local_9f0 + 3) = (int)local_288[3];
      local_9f0[4] = local_288[4];
      *(int *)(local_9f0 + 5) = (int)local_288[5];
      *(undefined4 *)((long)local_9f0 + 0x2c) = *(undefined4 *)((long)local_288 + 0x2c);
      *(int *)(local_9f0 + 6) = (int)local_288[6];
      *(undefined4 *)((long)local_9f0 + 0x34) = *(undefined4 *)((long)local_288 + 0x34);
      *(int *)(local_9f0 + 7) = (int)local_288[7];
      local_9f0[8] = local_288[8];
    }
  }
  return;
}

Assistant:

static void innerproduct_transform_kernel_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
#endif
{
#if NCNN_RUNTIME_CPU && NCNN_IMPL_FP16S && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_transform_kernel_fp16s_sse_f16c(weight_data, weight_data_tm, num_input, num_output, opt);
        return;
    }
#else // NCNN_RUNTIME_CPU

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (out_elempack == 16)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 16, (size_t)32u, 16);
#else
        weight_data_tm.create(num_input, num_output / 16, (size_t)64u, 16);
#endif

        for (int q = 0; q + 15 < num_output; q += 16)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 16);
#else
            float* g0 = weight_data_tm.row(q / 16);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);
            const float* k8 = weight_data_r2.row(q + 8);
            const float* k9 = weight_data_r2.row(q + 9);
            const float* ka = weight_data_r2.row(q + 10);
            const float* kb = weight_data_r2.row(q + 11);
            const float* kc = weight_data_r2.row(q + 12);
            const float* kd = weight_data_r2.row(q + 13);
            const float* ke = weight_data_r2.row(q + 14);
            const float* kf = weight_data_r2.row(q + 15);

            int p = 0;
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 16x16
#if NCNN_IMPL_FP16S
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m256i _r8 = _mm512_cvtps_ph(_mm512_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m256i _r9 = _mm512_cvtps_ph(_mm512_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m256i _ra = _mm512_cvtps_ph(_mm512_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m256i _rb = _mm512_cvtps_ph(_mm512_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m256i _rc = _mm512_cvtps_ph(_mm512_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m256i _rd = _mm512_cvtps_ph(_mm512_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m256i _re = _mm512_cvtps_ph(_mm512_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m256i _rf = _mm512_cvtps_ph(_mm512_loadu_ps(kf), _MM_FROUND_TRUNC);

                transpose16x16_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 8), _r8);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 9), _r9);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 10), _ra);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 11), _rb);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 12), _rc);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 13), _rd);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 14), _re);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 15), _rf);
#else
                __m512 _r0 = _mm512_loadu_ps(k0);
                __m512 _r1 = _mm512_loadu_ps(k1);
                __m512 _r2 = _mm512_loadu_ps(k2);
                __m512 _r3 = _mm512_loadu_ps(k3);
                __m512 _r4 = _mm512_loadu_ps(k4);
                __m512 _r5 = _mm512_loadu_ps(k5);
                __m512 _r6 = _mm512_loadu_ps(k6);
                __m512 _r7 = _mm512_loadu_ps(k7);
                __m512 _r8 = _mm512_loadu_ps(k8);
                __m512 _r9 = _mm512_loadu_ps(k9);
                __m512 _ra = _mm512_loadu_ps(ka);
                __m512 _rb = _mm512_loadu_ps(kb);
                __m512 _rc = _mm512_loadu_ps(kc);
                __m512 _rd = _mm512_loadu_ps(kd);
                __m512 _re = _mm512_loadu_ps(ke);
                __m512 _rf = _mm512_loadu_ps(kf);

                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm512_storeu_ps(g0, _r0);
                _mm512_storeu_ps(g0 + 16, _r1);
                _mm512_storeu_ps(g0 + 16 * 2, _r2);
                _mm512_storeu_ps(g0 + 16 * 3, _r3);
                _mm512_storeu_ps(g0 + 16 * 4, _r4);
                _mm512_storeu_ps(g0 + 16 * 5, _r5);
                _mm512_storeu_ps(g0 + 16 * 6, _r6);
                _mm512_storeu_ps(g0 + 16 * 7, _r7);
                _mm512_storeu_ps(g0 + 16 * 8, _r8);
                _mm512_storeu_ps(g0 + 16 * 9, _r9);
                _mm512_storeu_ps(g0 + 16 * 10, _ra);
                _mm512_storeu_ps(g0 + 16 * 11, _rb);
                _mm512_storeu_ps(g0 + 16 * 12, _rc);
                _mm512_storeu_ps(g0 + 16 * 13, _rd);
                _mm512_storeu_ps(g0 + 16 * 14, _re);
                _mm512_storeu_ps(g0 + 16 * 15, _rf);
#endif

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                k8 += 16;
                k9 += 16;
                ka += 16;
                kb += 16;
                kc += 16;
                kd += 16;
                ke += 16;
                kf += 16;
                g0 += 256;
            }
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 8x16
#if NCNN_IMPL_FP16S
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m128i _r8 = _mm256_cvtps_ph(_mm256_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m128i _r9 = _mm256_cvtps_ph(_mm256_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m128i _ra = _mm256_cvtps_ph(_mm256_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m128i _rb = _mm256_cvtps_ph(_mm256_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m128i _rc = _mm256_cvtps_ph(_mm256_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m128i _rd = _mm256_cvtps_ph(_mm256_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m128i _re = _mm256_cvtps_ph(_mm256_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m128i _rf = _mm256_cvtps_ph(_mm256_loadu_ps(kf), _MM_FROUND_TRUNC);

                __m256i _r08 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r0), _r8, 1);
                __m256i _r19 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r1), _r9, 1);
                __m256i _r2a = _mm256_inserti128_si256(_mm256_castsi128_si256(_r2), _ra, 1);
                __m256i _r3b = _mm256_inserti128_si256(_mm256_castsi128_si256(_r3), _rb, 1);
                __m256i _r4c = _mm256_inserti128_si256(_mm256_castsi128_si256(_r4), _rc, 1);
                __m256i _r5d = _mm256_inserti128_si256(_mm256_castsi128_si256(_r5), _rd, 1);
                __m256i _r6e = _mm256_inserti128_si256(_mm256_castsi128_si256(_r6), _re, 1);
                __m256i _r7f = _mm256_inserti128_si256(_mm256_castsi128_si256(_r7), _rf, 1);

                __m256i _tmp0 = _mm256_unpacklo_epi16(_r08, _r19);
                __m256i _tmp1 = _mm256_unpackhi_epi16(_r08, _r19);
                __m256i _tmp2 = _mm256_unpacklo_epi16(_r2a, _r3b);
                __m256i _tmp3 = _mm256_unpackhi_epi16(_r2a, _r3b);
                __m256i _tmp4 = _mm256_unpacklo_epi16(_r4c, _r5d);
                __m256i _tmp5 = _mm256_unpackhi_epi16(_r4c, _r5d);
                __m256i _tmp6 = _mm256_unpacklo_epi16(_r6e, _r7f);
                __m256i _tmp7 = _mm256_unpackhi_epi16(_r6e, _r7f);

                __m256i _tmpg = _mm256_unpacklo_epi32(_tmp0, _tmp2);
                __m256i _tmph = _mm256_unpackhi_epi32(_tmp0, _tmp2);
                __m256i _tmpi = _mm256_unpacklo_epi32(_tmp1, _tmp3);
                __m256i _tmpj = _mm256_unpackhi_epi32(_tmp1, _tmp3);
                __m256i _tmpk = _mm256_unpacklo_epi32(_tmp4, _tmp6);
                __m256i _tmpl = _mm256_unpackhi_epi32(_tmp4, _tmp6);
                __m256i _tmpm = _mm256_unpacklo_epi32(_tmp5, _tmp7);
                __m256i _tmpn = _mm256_unpackhi_epi32(_tmp5, _tmp7);

                _r08 = _mm256_unpacklo_epi64(_tmpg, _tmpk);
                _r19 = _mm256_unpackhi_epi64(_tmpg, _tmpk);
                _r2a = _mm256_unpacklo_epi64(_tmph, _tmpl);
                _r3b = _mm256_unpackhi_epi64(_tmph, _tmpl);
                _r4c = _mm256_unpacklo_epi64(_tmpi, _tmpm);
                _r5d = _mm256_unpackhi_epi64(_tmpi, _tmpm);
                _r6e = _mm256_unpacklo_epi64(_tmpj, _tmpn);
                _r7f = _mm256_unpackhi_epi64(_tmpj, _tmpn);

                _mm256_storeu_si256((__m256i*)g0, _r08);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r19);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2a);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3b);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4c);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5d);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6e);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7f);
#else
                __m256 _r0 = _mm256_loadu_ps(k0);
                __m256 _r1 = _mm256_loadu_ps(k1);
                __m256 _r2 = _mm256_loadu_ps(k2);
                __m256 _r3 = _mm256_loadu_ps(k3);
                __m256 _r4 = _mm256_loadu_ps(k4);
                __m256 _r5 = _mm256_loadu_ps(k5);
                __m256 _r6 = _mm256_loadu_ps(k6);
                __m256 _r7 = _mm256_loadu_ps(k7);
                __m256 _r8 = _mm256_loadu_ps(k8);
                __m256 _r9 = _mm256_loadu_ps(k9);
                __m256 _ra = _mm256_loadu_ps(ka);
                __m256 _rb = _mm256_loadu_ps(kb);
                __m256 _rc = _mm256_loadu_ps(kc);
                __m256 _rd = _mm256_loadu_ps(kd);
                __m256 _re = _mm256_loadu_ps(ke);
                __m256 _rf = _mm256_loadu_ps(kf);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm256_storeu_ps(g0, _r0);
                _mm256_storeu_ps(g0 + 8, _r1);
                _mm256_storeu_ps(g0 + 8 * 2, _r2);
                _mm256_storeu_ps(g0 + 8 * 3, _r3);
                _mm256_storeu_ps(g0 + 8 * 4, _r4);
                _mm256_storeu_ps(g0 + 8 * 5, _r5);
                _mm256_storeu_ps(g0 + 8 * 6, _r6);
                _mm256_storeu_ps(g0 + 8 * 7, _r7);
                _mm256_storeu_ps(g0 + 8 * 8, _r8);
                _mm256_storeu_ps(g0 + 8 * 9, _r9);
                _mm256_storeu_ps(g0 + 8 * 10, _ra);
                _mm256_storeu_ps(g0 + 8 * 11, _rb);
                _mm256_storeu_ps(g0 + 8 * 12, _rc);
                _mm256_storeu_ps(g0 + 8 * 13, _rd);
                _mm256_storeu_ps(g0 + 8 * 14, _re);
                _mm256_storeu_ps(g0 + 8 * 15, _rf);
#endif

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                k8 += 8;
                k9 += 8;
                ka += 8;
                kb += 8;
                kc += 8;
                kd += 8;
                ke += 8;
                kf += 8;
                g0 += 128;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
                g0[8] = float32_to_float16(*k8++);
                g0[9] = float32_to_float16(*k9++);
                g0[10] = float32_to_float16(*ka++);
                g0[11] = float32_to_float16(*kb++);
                g0[12] = float32_to_float16(*kc++);
                g0[13] = float32_to_float16(*kd++);
                g0[14] = float32_to_float16(*ke++);
                g0[15] = float32_to_float16(*kf++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
                g0[4] = *k4++;
                g0[5] = *k5++;
                g0[6] = *k6++;
                g0[7] = *k7++;
                g0[8] = *k8++;
                g0[9] = *k9++;
                g0[10] = *ka++;
                g0[11] = *kb++;
                g0[12] = *kc++;
                g0[13] = *kd++;
                g0[14] = *ke++;
                g0[15] = *kf++;
#endif
                g0 += 16;
            }
        }
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 8, (size_t)16u, 8);
#else
        weight_data_tm.create(num_input, num_output / 8, (size_t)32u, 8);
#endif

        for (int q = 0; q + 7 < num_output; q += 8)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 8);
#else
            float* g0 = weight_data_tm.row(q / 8);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);

            int p = 0;
#if __AVX512F__
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 16x8
#if NCNN_IMPL_FP16S
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);

                transpose16x8_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);
#else
                __m512 _r0 = _mm512_loadu_ps(k0);
                __m512 _r1 = _mm512_loadu_ps(k1);
                __m512 _r2 = _mm512_loadu_ps(k2);
                __m512 _r3 = _mm512_loadu_ps(k3);
                __m512 _r4 = _mm512_loadu_ps(k4);
                __m512 _r5 = _mm512_loadu_ps(k5);
                __m512 _r6 = _mm512_loadu_ps(k6);
                __m512 _r7 = _mm512_loadu_ps(k7);

                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm512_storeu_ps(g0, _r0);
                _mm512_storeu_ps(g0 + 16, _r1);
                _mm512_storeu_ps(g0 + 16 * 2, _r2);
                _mm512_storeu_ps(g0 + 16 * 3, _r3);
                _mm512_storeu_ps(g0 + 16 * 4, _r4);
                _mm512_storeu_ps(g0 + 16 * 5, _r5);
                _mm512_storeu_ps(g0 + 16 * 6, _r6);
                _mm512_storeu_ps(g0 + 16 * 7, _r7);
#endif

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                g0 += 128;
            }
#endif // __AVX512F__
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 8x8
#if NCNN_IMPL_FP16S
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);

                transpose8x8_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm_storeu_si128((__m128i*)g0, _r0);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r1);
                _mm_storeu_si128((__m128i*)(g0 + 16), _r2);
                _mm_storeu_si128((__m128i*)(g0 + 24), _r3);
                _mm_storeu_si128((__m128i*)(g0 + 32), _r4);
                _mm_storeu_si128((__m128i*)(g0 + 40), _r5);
                _mm_storeu_si128((__m128i*)(g0 + 48), _r6);
                _mm_storeu_si128((__m128i*)(g0 + 56), _r7);
#else
                __m256 _r0 = _mm256_loadu_ps(k0);
                __m256 _r1 = _mm256_loadu_ps(k1);
                __m256 _r2 = _mm256_loadu_ps(k2);
                __m256 _r3 = _mm256_loadu_ps(k3);
                __m256 _r4 = _mm256_loadu_ps(k4);
                __m256 _r5 = _mm256_loadu_ps(k5);
                __m256 _r6 = _mm256_loadu_ps(k6);
                __m256 _r7 = _mm256_loadu_ps(k7);

                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm256_storeu_ps(g0, _r0);
                _mm256_storeu_ps(g0 + 8, _r1);
                _mm256_storeu_ps(g0 + 16, _r2);
                _mm256_storeu_ps(g0 + 24, _r3);
                _mm256_storeu_ps(g0 + 32, _r4);
                _mm256_storeu_ps(g0 + 40, _r5);
                _mm256_storeu_ps(g0 + 48, _r6);
                _mm256_storeu_ps(g0 + 56, _r7);
#endif

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                g0 += 64;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
                g0[4] = *k4++;
                g0[5] = *k5++;
                g0[6] = *k6++;
                g0[7] = *k7++;
#endif
                g0 += 8;
            }
        }
    }
#endif // __AVX__

    if (out_elempack == 4)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 4, (size_t)8u, 4);
#else
        weight_data_tm.create(num_input, num_output / 4, (size_t)16u, 4);
#endif

        for (int q = 0; q + 3 < num_output; q += 4)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 4);
#else
            float* g0 = weight_data_tm.row(q / 4);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);

            int p = 0;
            for (; p + 3 < num_input; p += 4)
            {
                // transpose 4x4
                __m128 _r0 = _mm_loadu_ps(k0);
                __m128 _r1 = _mm_loadu_ps(k1);
                __m128 _r2 = _mm_loadu_ps(k2);
                __m128 _r3 = _mm_loadu_ps(k3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
#if NCNN_IMPL_FP16S
                __m256 _r01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r0), _r1, 1);
                __m256 _r23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r2), _r3, 1);
                __m128i _r01_fp16 = _mm256_cvtps_ph(_r01, _MM_FROUND_TRUNC);
                __m128i _r23_fp16 = _mm256_cvtps_ph(_r23, _MM_FROUND_TRUNC);
                _mm_storeu_si128((__m128i*)g0, _r01_fp16);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r23_fp16);
#else
                _mm_storeu_ps(g0, _r0);
                _mm_storeu_ps(g0 + 4, _r1);
                _mm_storeu_ps(g0 + 8, _r2);
                _mm_storeu_ps(g0 + 12, _r3);
#endif

                k0 += 4;
                k1 += 4;
                k2 += 4;
                k3 += 4;
                g0 += 16;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
#endif
                g0 += 4;
            }
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
#if NCNN_IMPL_FP16S
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);
        ncnn::cast_float32_to_float16(weight_data_r2, weight_data_tm, opt);
#else
        weight_data_tm = weight_data;
#endif
    }
#endif // NCNN_RUNTIME_CPU
}